

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::
optimize_functor<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
::operator()(optimize_functor<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
             *this,atomic_bool *stop_task,
            best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
            *best_recorder,
            vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *constraints,int variables,default_cost_type<double> *original_costs,
            double cost_constant)

{
  double dVar1;
  double dVar2;
  double __y;
  double theta;
  double dVar3;
  double kappa;
  double objective_amplifier;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  context *ctx;
  bool bVar6;
  int iVar7;
  int iVar8;
  local_context *ctx_00;
  int push;
  int iVar9;
  long loop;
  double dVar10;
  undefined1 auVar12 [16];
  double dVar11;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 extraout_var [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bit_array x;
  int local_16c;
  double local_168;
  default_cost_type<double> norm_costs;
  compute_order compute;
  solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  slv;
  undefined1 extraout_var_00 [56];
  
  bit_array_impl::bit_array_impl(&x.super_bit_array_impl,variables);
  ctx = this->m_ctx;
  ctx_00 = &this->m_local_ctx;
  normalize_costs<double,baryonyx::itm::default_cost_type<double>>
            ((itm *)&norm_costs,ctx,original_costs,&ctx_00->rng,variables);
  dVar1 = (ctx->parameters).kappa_step;
  local_168 = (ctx->parameters).delta;
  dVar2 = (ctx->parameters).kappa_max;
  __y = (ctx->parameters).alpha;
  theta = (ctx->parameters).theta;
  if (local_168 < 0.0) {
    local_168 = compute_delta<double,baryonyx::itm::default_cost_type<double>>
                          (this->m_ctx,&norm_costs,theta,variables);
  }
  dVar3 = (ctx->parameters).w;
  kappa = (ctx->parameters).pushing_k_factor;
  objective_amplifier = (ctx->parameters).pushing_objective_amplifier;
  solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  ::solver_inequalities_101coeff
            (&slv,&ctx_00->rng,
             (int)(((long)(constraints->
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(constraints->
                         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x28),variables,&norm_costs,
             constraints);
  compute_order::compute_order(&compute,(ctx->parameters).order,variables);
  do {
    bVar6 = false;
LAB_004054d6:
    if (((stop_task->_M_base)._M_i & 1U) != 0) {
      compute_order::~compute_order(&compute);
      solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
      ::~solver_inequalities_101coeff(&slv);
      std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
                (&norm_costs.linear_elements);
      std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
                (&x.super_bit_array_impl.m_data);
      return;
    }
    this->m_call_number = this->m_call_number + 1;
    dVar10 = best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
             ::reinit(best_recorder,ctx_00,bVar6,(ctx->parameters).kappa_min,
                      (ctx->parameters).kappa_max,&x);
    compute_order::
    init<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array>
              (&compute,&slv,&x);
    auVar14 = ZEXT864((ulong)dVar10);
    iVar9 = 0x7fffffff;
    for (loop = 0; (((stop_task->_M_base)._M_i & 1U) == 0 && (loop != (ctx->parameters).limit));
        loop = loop + 1) {
      auVar12._0_8_ = auVar14._0_8_;
      iVar7 = compute_order::
              run<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                        (&compute,&slv,&x,&ctx_00->rng,auVar12._0_8_,local_168,theta);
      if (iVar7 == 0) {
        dVar11 = default_cost_type<double>::results(original_costs,&x,cost_constant);
        best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
        ::try_update(best_recorder,ctx_00,&x,dVar11,loop);
        bVar6 = true;
        goto LAB_00405628;
      }
      if (iVar7 <= iVar9) {
        iVar9 = iVar7;
      }
      if ((long)dVar3 < loop) {
        auVar14._0_8_ = pow((double)iVar7 / (double)slv.m,__y);
        auVar14._8_56_ = extraout_var;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = auVar12._0_8_;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = dVar1;
        auVar12 = vfmadd231sd_fma(auVar16,auVar14._0_16_,auVar4);
      }
      else {
        auVar12._8_8_ = 0;
      }
      auVar14 = ZEXT1664(auVar12);
      if (dVar2 < auVar12._0_8_) break;
    }
    if (iVar9 < 1) {
      bVar6 = false;
LAB_00405628:
      local_16c = 0;
      for (iVar9 = 0;
          (((stop_task->_M_base)._M_i & 1U) == 0 && (iVar9 < (ctx->parameters).pushes_limit));
          iVar9 = iVar9 + 1) {
        iVar7 = compute_order::
                push_and_run<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                          (&compute,&slv,&x,&ctx_00->rng,kappa,local_168,theta,objective_amplifier);
        if (iVar7 == 0) {
          dVar11 = default_cost_type<double>::results(original_costs,&x,cost_constant);
          best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
          ::try_update(best_recorder,ctx_00,&x,dVar11,
                       (long)~((ctx->parameters).pushing_iteration_limit * iVar9));
          bVar6 = true;
        }
        auVar14 = ZEXT864((ulong)dVar10);
        iVar7 = 1;
        while( true ) {
          if ((((stop_task->_M_base)._M_i & 1U) != 0) ||
             ((ctx->parameters).pushing_iteration_limit <= iVar7 + -1)) goto LAB_004057b8;
          auVar13._0_8_ = auVar14._0_8_;
          iVar8 = compute_order::
                  run<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                            (&compute,&slv,&x,&ctx_00->rng,auVar13._0_8_,local_168,theta);
          if (iVar8 == 0) break;
          if ((double)(iVar7 + -1) <= (ctx->parameters).w) {
            auVar13._8_8_ = 0;
          }
          else {
            auVar15._0_8_ = pow((double)iVar8 / (double)slv.m,__y);
            auVar15._8_56_ = extraout_var_00;
            auVar17._8_8_ = 0;
            auVar17._0_8_ = auVar13._0_8_;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = dVar1;
            auVar13 = vfmadd231sd_fma(auVar17,auVar15._0_16_,auVar5);
          }
          auVar14 = ZEXT1664(auVar13);
          if (dVar2 < auVar13._0_8_) goto LAB_004057b8;
          iVar7 = iVar7 + 1;
        }
        dVar11 = default_cost_type<double>::results(original_costs,&x,cost_constant);
        best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
        ::try_update(best_recorder,ctx_00,&x,dVar11,
                     (long)((ctx->parameters).pushing_iteration_limit * local_16c - iVar7));
        bVar6 = true;
LAB_004057b8:
        local_16c = local_16c + -1;
      }
      goto LAB_004054d6;
    }
    best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
    ::try_advance(best_recorder,ctx_00,&x,iVar9,(ctx->parameters).limit);
  } while( true );
}

Assistant:

void operator()(const std::atomic_bool& stop_task,
                    best_solution_recorder<Cost, Float, Mode>& best_recorder,
                    const std::vector<merged_constraint>& constraints,
                    int variables,
                    const Cost& original_costs,
                    double cost_constant)
    {
        bit_array x(variables);

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_local_ctx.rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const auto w_limit = static_cast<long int>(p.w);

        Solver slv(m_local_ctx.rng,
                   length(constraints),
                   variables,
                   norm_costs,
                   constraints);

        compute_order compute(p.order, variables);
        bool is_a_solution = false;

        while (!stop_task.load()) {
            ++m_call_number;
            const auto kappa_start = static_cast<Float>(best_recorder.reinit(
              m_local_ctx, is_a_solution, p.kappa_min, p.kappa_max, x));
            auto kappa = kappa_start;
            compute.init(slv, x);

            auto best_remaining = INT_MAX;
            is_a_solution = false;

            for (long int i = 0; !stop_task.load() && i != p.limit; ++i) {
                auto remaining =
                  compute.run(slv, x, m_local_ctx.rng, kappa, delta, theta);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      i);

                    best_remaining = 0;
                    is_a_solution = true;
                    break;
                } else {
                    best_remaining = std::min(remaining, best_remaining);
                }

                if (i > w_limit)
                    kappa +=
                      kappa_step * std::pow(static_cast<Float>(remaining) /
                                              static_cast<Float>(slv.m),
                                            alpha);

                if (kappa > kappa_max)
                    break;
            }

            if (best_remaining > 0) {
                best_recorder.try_advance(
                  m_local_ctx, x, best_remaining, p.limit);
                continue;
            }

            for (int push = 0; !stop_task.load() && push < p.pushes_limit;
                 ++push) {

                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_local_ctx.rng,
                                       pushing_k_factor,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      -push * p.pushing_iteration_limit - 1);
                    is_a_solution = true;
                }

                kappa = kappa_start;
                for (int iter = 0;
                     !stop_task.load() && iter < p.pushing_iteration_limit;
                     ++iter) {

                    remaining = compute.run(
                      slv, x, m_local_ctx.rng, kappa, delta, theta);

                    if (remaining == 0) {
                        best_recorder.try_update(
                          m_local_ctx,
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        is_a_solution = true;
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;
                }
            }
        }
    }